

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_group_set_scroll(nk_context *ctx,char *id,nk_uint x_offset,nk_uint y_offset)

{
  nk_window *win;
  int len;
  nk_hash name;
  nk_uint *pnVar1;
  nk_uint *pnVar2;
  nk_uint value;
  
  if ((((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
      (id != (char *)0x0)) && (win->layout != (nk_panel *)0x0)) {
    value = y_offset;
    len = nk_strlen(id);
    name = nk_murmur_hash(id,len,2);
    pnVar1 = nk_find_value(win,name);
    if (pnVar1 == (nk_uint *)0x0) {
      pnVar1 = nk_add_value(ctx,win,name,value);
      pnVar2 = nk_add_value(ctx,win,name + 1,value);
      if (pnVar2 == (nk_uint *)0x0 || pnVar1 == (nk_uint *)0x0) {
        return;
      }
      *pnVar2 = 0;
      *pnVar1 = 0;
    }
    else {
      pnVar2 = nk_find_value(win,name + 1);
    }
    *pnVar1 = x_offset;
    *pnVar2 = y_offset;
  }
  return;
}

Assistant:

NK_API void
nk_group_set_scroll(struct nk_context *ctx, const char *id, nk_uint x_offset, nk_uint y_offset)
{
int id_len;
nk_hash id_hash;
struct nk_window *win;
nk_uint *x_offset_ptr;
nk_uint *y_offset_ptr;

NK_ASSERT(ctx);
NK_ASSERT(id);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !id)
return;

/* find persistent group scrollbar value */
win = ctx->current;
id_len = (int)nk_strlen(id);
id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
x_offset_ptr = nk_find_value(win, id_hash);
if (!x_offset_ptr) {
x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

NK_ASSERT(x_offset_ptr);
NK_ASSERT(y_offset_ptr);
if (!x_offset_ptr || !y_offset_ptr) return;
*x_offset_ptr = *y_offset_ptr = 0;
} else y_offset_ptr = nk_find_value(win, id_hash+1);
*x_offset_ptr = x_offset;
*y_offset_ptr = y_offset;
}